

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O0

void test_empty_simplex_tree<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>
               (Simplex_tree<Gudhi::Simplex_tree_options_default> *tst)

{
  undefined8 uVar1;
  bool bVar2;
  Vertex_handle VVar3;
  Vertex_handle VVar4;
  int iVar5;
  lazy_ostream *plVar6;
  size_t sVar7;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
  *pSVar8;
  basic_cstring<const_char> local_4a0;
  basic_cstring<const_char> local_490;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_480;
  assertion_result local_460;
  basic_cstring<const_char> local_448;
  basic_cstring<const_char> local_438;
  basic_cstring<const_char> local_428;
  basic_cstring<const_char> local_418;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_408;
  assertion_result local_3e8;
  basic_cstring<const_char> local_3d0;
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  basic_cstring<const_char> local_3a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_390;
  assertion_result local_370;
  basic_cstring<const_char> local_358;
  basic_cstring<const_char> local_348;
  basic_cstring<const_char> local_338;
  basic_cstring<const_char> local_328;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_318;
  assertion_result local_2f8;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  Siblings *local_2c0;
  Siblings *STRoot;
  basic_cstring<const_char> local_2a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_298;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_278;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  assertion_result local_240;
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1e8;
  assertion_result local_1c8;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_170;
  assertion_result local_150;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_f8;
  assertion_result local_d8;
  basic_cstring<const_char> local_c0;
  basic_cstring<const_char> local_b0;
  basic_cstring<const_char> local_a0 [2];
  basic_cstring<const_char> local_80;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_70;
  assertion_result local_50;
  basic_cstring<const_char> local_38;
  basic_cstring<const_char> local_28;
  undefined4 local_14;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *pSStack_10;
  Vertex_handle DEFAULT_VERTEX_VALUE;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *tst_local;
  
  local_14 = 0xffffffff;
  pSStack_10 = tst;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_38);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_28,0x2c,&local_38);
    VVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::null_vertex(pSStack_10);
    boost::test_tools::assertion_result::assertion_result(&local_50,VVar3 == -1);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_80,"tst.null_vertex() == DEFAULT_VERTEX_VALUE",0x29);
    boost::unit_test::operator<<(&local_70,plVar6,&local_80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_50,&local_70,local_a0,0x2c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_70);
    boost::test_tools::assertion_result::~assertion_result(&local_50);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b0,0x2d,&local_c0);
    sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_vertices(pSStack_10);
    boost::test_tools::assertion_result::assertion_result(&local_d8,sVar7 == 0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,"tst.num_vertices() == (size_t) 0",0x20);
    boost::unit_test::operator<<(&local_f8,plVar6,&local_108);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_d8,&local_f8,&local_118,0x2d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_f8);
    boost::test_tools::assertion_result::~assertion_result(&local_d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_138);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_128,0x2e,&local_138);
    sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices(pSStack_10);
    boost::test_tools::assertion_result::assertion_result(&local_150,sVar7 == 0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,"tst.num_simplices() == (size_t) 0",0x21);
    boost::unit_test::operator<<(&local_170,plVar6,&local_180);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_150,&local_170,&local_190,0x2e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_170);
    boost::test_tools::assertion_result::~assertion_result(&local_150);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1a0,0x2f,&local_1b0);
    bVar2 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::is_empty(pSStack_10);
    boost::test_tools::assertion_result::assertion_result(&local_1c8,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,"tst.is_empty()",0xe);
    boost::unit_test::operator<<(&local_1e8,plVar6,&local_1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_1c8,&local_1e8,&local_208,0x2f,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1e8);
    boost::test_tools::assertion_result::~assertion_result(&local_1c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_228);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_218,0x30,&local_228);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension
              (&local_258,pSStack_10);
    local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_278);
    bVar2 = std::operator==(&local_258,&local_278);
    boost::test_tools::assertion_result::assertion_result(&local_240,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,"tst.num_simplices_by_dimension() == std::vector<size_t>()",0x39);
    boost::unit_test::operator<<(&local_298,plVar6,&local_2a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&STRoot,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_240,&local_298,&STRoot,0x30,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_298);
    boost::test_tools::assertion_result::~assertion_result(&local_240);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_278);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_258);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_2c0 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::root(pSStack_10);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2d0,0x32,&local_2e0);
    boost::test_tools::assertion_result::assertion_result(&local_2f8,local_2c0 != (Siblings *)0x0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_328,"STRoot != nullptr",0x11);
    boost::unit_test::operator<<(&local_318,plVar6,&local_328);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_2f8,&local_318,&local_338,0x32,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_318);
    boost::test_tools::assertion_result::~assertion_result(&local_2f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_348,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_358);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_348,0x33,&local_358);
    pSVar8 = Gudhi::
             Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
             ::oncles(local_2c0);
    boost::test_tools::assertion_result::assertion_result
              (&local_370,
               pSVar8 == (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
                          *)0x0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a0,"STRoot->oncles() == nullptr",0x1b);
    boost::unit_test::operator<<(&local_390,plVar6,&local_3a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_370,&local_390,&local_3b0,0x33,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_390);
    boost::test_tools::assertion_result::~assertion_result(&local_370);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3c0,0x34,&local_3d0);
    VVar4 = Gudhi::
            Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
            ::parent(local_2c0);
    boost::test_tools::assertion_result::assertion_result(&local_3e8,VVar4 == -1);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,"STRoot->parent() == DEFAULT_VERTEX_VALUE",0x28);
    boost::unit_test::operator<<(&local_408,plVar6,&local_418);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_3e8,&local_408,&local_428,0x34,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_408);
    boost::test_tools::assertion_result::~assertion_result(&local_3e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_438,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_448);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_438,0x35,&local_448);
    iVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(pSStack_10);
    boost::test_tools::assertion_result::assertion_result(&local_460,iVar5 == -1);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_490,"tst.dimension() == -1",0x15);
    boost::unit_test::operator<<(&local_480,plVar6,&local_490);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
               ,0x76);
    boost::test_tools::tt_detail::report_assertion(&local_460,&local_480,&local_4a0,0x35,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_480);
    boost::test_tools::assertion_result::~assertion_result(&local_460);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

void test_empty_simplex_tree(const typeST& tst) {
  typedef typename typeST::Vertex_handle Vertex_handle;
  const Vertex_handle DEFAULT_VERTEX_VALUE = Vertex_handle(- 1);
  BOOST_CHECK(tst.null_vertex() == DEFAULT_VERTEX_VALUE);
  BOOST_CHECK(tst.num_vertices() == (size_t) 0);
  BOOST_CHECK(tst.num_simplices() == (size_t) 0);
  BOOST_CHECK(tst.is_empty());
  BOOST_CHECK(tst.num_simplices_by_dimension() == std::vector<size_t>());
  const typename typeST::Siblings* STRoot = tst.root();
  BOOST_CHECK(STRoot != nullptr);
  BOOST_CHECK(STRoot->oncles() == nullptr);
  BOOST_CHECK(STRoot->parent() == DEFAULT_VERTEX_VALUE);
  BOOST_CHECK(tst.dimension() == -1);
}